

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O3

void __thiscall wasm::SSAify::~SSAify(SSAify *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppEVar2;
  pointer pcVar3;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__SSAify_00d76718;
  ppEVar2 = (this->functionPrepends).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->functionPrepends).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar3 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }